

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# classmetadata.cpp
# Opt level: O0

int __thiscall
stackjit::ClassMetadata::getVirtualFunctionIndex(ClassMetadata *this,FunctionDefinition *funcDef)

{
  int iVar1;
  FunctionDefinition *function;
  string *psVar2;
  size_type sVar3;
  runtime_error *this_00;
  mapped_type *pmVar4;
  char local_f0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90 [48];
  FunctionSignature local_60;
  string local_40 [8];
  string signature;
  FunctionDefinition *rootDef;
  FunctionDefinition *funcDef_local;
  ClassMetadata *this_local;
  
  function = getVirtualFunctionRootDefinition(this,funcDef);
  FunctionSignature::from(&local_60,function);
  psVar2 = FunctionSignature::str_abi_cxx11_(&local_60);
  std::__cxx11::string::string(local_40,(string *)psVar2);
  FunctionSignature::~FunctionSignature(&local_60);
  sVar3 = std::
          unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
          ::count(&this->mVirtualFunctionToIndex,(key_type *)local_40);
  if (sVar3 == 0) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::operator+(local_f0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            "There exists no virtual function \'");
    std::operator+(local_d0,local_f0);
    std::operator+(local_b0,local_d0);
    std::operator+(local_90,(char *)local_b0);
    std::runtime_error::runtime_error(this_00,(string *)local_90);
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  pmVar4 = std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::at(&this->mVirtualFunctionToIndex,(key_type *)local_40);
  iVar1 = *pmVar4;
  std::__cxx11::string::~string(local_40);
  return iVar1;
}

Assistant:

int ClassMetadata::getVirtualFunctionIndex(const FunctionDefinition& funcDef) const {
		auto rootDef = getVirtualFunctionRootDefinition(&funcDef);
		auto signature = FunctionSignature::from(*rootDef).str();
		if (mVirtualFunctionToIndex.count(signature) == 0) {
			throw std::runtime_error("There exists no virtual function '" + signature + "' in the class '" + mName + "'.");
		}

		return mVirtualFunctionToIndex.at(signature);
	}